

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JulianCalendar.cpp
# Opt level: O0

void __thiscall JulianCalendar::JulianCalendar(JulianCalendar *this,int date)

{
  int iVar1;
  int d;
  int iVar2;
  JulianCalendar local_68;
  undefined1 local_48 [4];
  int JulDay;
  JulianCalendar local_30;
  int local_14;
  JulianCalendar *pJStack_10;
  int date_local;
  JulianCalendar *this_local;
  
  local_14 = date;
  pJStack_10 = this;
  Calendar::Calendar(&this->super_Calendar);
  (this->super_Calendar)._vptr_Calendar = (_func_int **)&PTR_getDefYearLen_002ddd60;
  (this->super_Calendar).year = (local_14 + -2) / 0x16e;
  while( true ) {
    iVar2 = local_14;
    JulianCalendar(&local_30,1,1,(this->super_Calendar).year + 1);
    iVar1 = operator_cast_to_int(&local_30);
    if (iVar2 < iVar1) break;
    (this->super_Calendar).year = (this->super_Calendar).year + 1;
  }
  (this->super_Calendar).month = 1;
  while( true ) {
    iVar1 = local_14;
    iVar2 = (this->super_Calendar).month;
    d = LastMonthDay(this,(this->super_Calendar).month,(this->super_Calendar).year);
    JulianCalendar((JulianCalendar *)local_48,iVar2,d,(this->super_Calendar).year);
    iVar2 = operator_cast_to_int((JulianCalendar *)local_48);
    if (iVar1 <= iVar2) break;
    (this->super_Calendar).month = (this->super_Calendar).month + 1;
  }
  JulianCalendar(&local_68,(this->super_Calendar).month,1,(this->super_Calendar).year);
  iVar2 = operator_cast_to_int(&local_68);
  (this->super_Calendar).day = (local_14 - iVar2) + 1;
  return;
}

Assistant:

JulianCalendar::JulianCalendar(int date) {
    year = (date + JulianEpoch) / year_max_len;
    while (date >= JulianCalendar(1, 1, year + 1))
        year++;
    month = 1;
    while (date > JulianCalendar(month, LastMonthDay(month, year), year))
        month++;
    int JulDay = JulianCalendar(month, 1, year);
    day = date - JulDay + 1;
}